

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O1

void flavor_assign_random(uint8_t tval)

{
  int iVar1;
  uint32_t uVar2;
  flavor *pfVar3;
  uint32_t m;
  ulong uVar4;
  
  m = 0;
  for (pfVar3 = flavors; pfVar3 != (flavor *)0x0; pfVar3 = pfVar3->next) {
    if (pfVar3->tval == tval) {
      m = m + (pfVar3->sval == '\0');
    }
  }
  if (z_info->k_max != 0) {
    uVar4 = 0;
    do {
      if ((k_info[uVar4].tval == (uint)tval) && (k_info[uVar4].flavor == (flavor *)0x0)) {
        if (m == 0) {
          quit_fmt("Not enough flavors for tval %d.",(ulong)tval);
        }
        uVar2 = Rand_div(m);
        for (pfVar3 = flavors; pfVar3 != (flavor *)0x0; pfVar3 = pfVar3->next) {
          if ((pfVar3->tval == tval) && (pfVar3->sval == '\0')) {
            if (uVar2 == 0) {
              k_info[uVar4].flavor = pfVar3;
              iVar1 = k_info[uVar4].sval;
              pfVar3->sval = (uint8_t)iVar1;
              if (tval == '\x19') {
                pfVar3->text = scroll_adj[iVar1];
              }
              m = m - 1;
              break;
            }
            uVar2 = uVar2 - 1;
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < z_info->k_max);
  }
  return;
}

Assistant:

static void flavor_assign_random(uint8_t tval)
{
	int i;
	int flavor_count = 0;
	int choice;
	struct flavor *f;

	/* Count the random flavors for the given tval */
	for (f = flavors; f; f = f->next)
		if (f->tval == tval && f->sval == SV_UNKNOWN)
			flavor_count++;

	for (i = 0; i < z_info->k_max; i++) {
		if (k_info[i].tval != tval || k_info[i].flavor)
			continue;

		if (!flavor_count)
			quit_fmt("Not enough flavors for tval %d.", tval);

		choice = randint0(flavor_count);
	
		for (f = flavors; f; f = f->next) {
			if (f->tval != tval || f->sval != SV_UNKNOWN)
				continue;

			if (choice == 0) {
				k_info[i].flavor = f;
				f->sval = k_info[i].sval;
				if (tval == TV_SCROLL)
					f->text = scroll_adj[k_info[i].sval];
				flavor_count--;
				break;
			}

			choice--;
		}
	}
}